

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  int threadNum;
  int maxTask;
  int blockTime;
  size_t sVar3;
  WebServer webServer;
  WebServer WStack_b8;
  
  if (argc < 7) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage:",6);
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x113200);
    }
    else {
      sVar3 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               " ip_address port_number thread_number maxTask_number waitTime flag_run_in_backstage(1"
               ,0x55);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    iVar2 = 1;
  }
  else {
    if (*argv[6] == '1') {
      daemonize();
    }
    pcVar1 = argv[1];
    iVar2 = atoi(argv[2]);
    threadNum = atoi(argv[3]);
    maxTask = atoi(argv[4]);
    blockTime = atoi(argv[5]);
    WebServer::WebServer(&WStack_b8,pcVar1,iVar2,threadNum,maxTask,blockTime);
    WebServer::run(&WStack_b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"WebServer over!",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    WebServer::~WebServer(&WStack_b8);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
    // test();

    if (argc < 7)
    {
        std::cout << "usage:" << argv[0] << " ip_address port_number thread_number maxTask_number waitTime flag_run_in_backstage(1\0)" << std::endl;
        return 1;
    }

    if (argv[6][0] == '1')
    {
        daemonize();
    }
    char *ip = argv[1];
    int port = atoi(argv[2]), threadNum = atoi(argv[3]), maxTask = atoi(argv[4]), blockTime = atoi(argv[5]);
    WebServer webServer(ip, port, threadNum, maxTask, blockTime);
    webServer.run();
    std::cout << "WebServer over!" << std::endl;
    return 0;
}